

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O0

RealType __thiscall OpenMD::Thermo::getNetCharge(Thermo *this)

{
  bool bVar1;
  SnapshotManager *this_00;
  AtomType *pAVar2;
  undefined8 *in_RDI;
  RealType RVar3;
  FluctuatingChargeAdapter fqa;
  FixedChargeAdapter fca;
  RealType netCharge;
  RealType charge;
  Atom *atom;
  Molecule *mol;
  iterator aiter;
  MoleculeIterator miter;
  Snapshot *snap;
  FluctuatingChargeAdapter in_stack_ffffffffffffffb0;
  FixedChargeAdapter local_48;
  RealType local_40;
  iterator *in_stack_ffffffffffffffc8;
  SimInfo *in_stack_ffffffffffffffd0;
  Molecule *local_28;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_20;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_18;
  Snapshot *local_10;
  
  this_00 = SimInfo::getSnapshotManager((SimInfo *)*in_RDI);
  local_10 = SnapshotManager::getCurrentSnapshot(this_00);
  if ((local_10->hasNetCharge & 1U) == 0) {
    std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(&local_18);
    __gnu_cxx::
    __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
    ::__normal_iterator(&local_20);
    local_40 = 0.0;
    local_28 = SimInfo::beginMolecule
                         (in_stack_ffffffffffffffd0,(MoleculeIterator *)in_stack_ffffffffffffffc8);
    while (local_28 != (Molecule *)0x0) {
      for (in_stack_ffffffffffffffd0 =
                (SimInfo *)
                Molecule::beginAtom((Molecule *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8)
          ; in_stack_ffffffffffffffd0 != (SimInfo *)0x0;
          in_stack_ffffffffffffffd0 =
               (SimInfo *)
               Molecule::nextAtom((Molecule *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8))
      {
        in_stack_ffffffffffffffc8 = (iterator *)0x0;
        pAVar2 = Atom::getAtomType((Atom *)in_stack_ffffffffffffffd0);
        FixedChargeAdapter::FixedChargeAdapter(&local_48,pAVar2);
        bVar1 = FixedChargeAdapter::isFixedCharge((FixedChargeAdapter *)0x168672);
        if (bVar1) {
          in_stack_ffffffffffffffc8 =
               (iterator *)
               FixedChargeAdapter::getCharge((FixedChargeAdapter *)in_stack_ffffffffffffffb0.at_);
        }
        pAVar2 = Atom::getAtomType((Atom *)in_stack_ffffffffffffffd0);
        FluctuatingChargeAdapter::FluctuatingChargeAdapter
                  ((FluctuatingChargeAdapter *)&stack0xffffffffffffffb0,pAVar2);
        bVar1 = FluctuatingChargeAdapter::isFluctuatingCharge((FluctuatingChargeAdapter *)0x1686a9);
        if (bVar1) {
          RVar3 = StuntDouble::getFlucQPos((StuntDouble *)in_stack_ffffffffffffffb0.at_);
          in_stack_ffffffffffffffc8 = (iterator *)(RVar3 + (double)in_stack_ffffffffffffffc8);
        }
        local_40 = (double)in_stack_ffffffffffffffc8 + local_40;
      }
      local_28 = SimInfo::nextMolecule((SimInfo *)0x0,(MoleculeIterator *)in_stack_ffffffffffffffc8)
      ;
    }
    Snapshot::setNetCharge(local_10,local_40);
  }
  RVar3 = Snapshot::getNetCharge(local_10);
  return RVar3;
}

Assistant:

RealType Thermo::getNetCharge() {
    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();

    if (!snap->hasNetCharge) {
      SimInfo::MoleculeIterator miter;
      vector<Atom*>::iterator aiter;
      Molecule* mol;
      Atom* atom;
      RealType charge;
      RealType netCharge(0.0);

      for (mol = info_->beginMolecule(miter); mol != NULL;
           mol = info_->nextMolecule(miter)) {
        for (atom = mol->beginAtom(aiter); atom != NULL;
             atom = mol->nextAtom(aiter)) {
          charge = 0.0;

          FixedChargeAdapter fca = FixedChargeAdapter(atom->getAtomType());
          if (fca.isFixedCharge()) { charge = fca.getCharge(); }

          FluctuatingChargeAdapter fqa =
              FluctuatingChargeAdapter(atom->getAtomType());
          if (fqa.isFluctuatingCharge()) { charge += atom->getFlucQPos(); }

          netCharge += charge;
        }
      }

#ifdef IS_MPI
      MPI_Allreduce(MPI_IN_PLACE, &netCharge, 1, MPI_REALTYPE, MPI_SUM,
                    MPI_COMM_WORLD);
#endif

      snap->setNetCharge(netCharge);
    }

    return snap->getNetCharge();
  }